

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O3

StreamWriter * __thiscall Json::StreamWriterBuilder::newStreamWriter(StreamWriterBuilder *this)

{
  bool bVar1;
  bool bVar2;
  bool useSpecialFloats;
  bool emitUTF8;
  UInt UVar3;
  int iVar4;
  Value *pVVar5;
  BuiltStyledStreamWriter *this_00;
  char *pcVar6;
  undefined8 uVar7;
  Enum cs;
  uint precision;
  Value *this_01;
  String colonSymbol;
  String nullSymbol;
  String local_138;
  String local_118;
  undefined8 local_f8;
  String indentation;
  String local_d0;
  String endingLineFeedSymbol;
  String pt_str;
  String cs_str;
  String local_50;
  
  this_01 = &this->settings_;
  pVVar5 = Value::operator[](this_01,"indentation");
  Value::asString_abi_cxx11_(&indentation,pVVar5);
  pVVar5 = Value::operator[](this_01,"commentStyle");
  Value::asString_abi_cxx11_(&cs_str,pVVar5);
  pVVar5 = Value::operator[](this_01,"precisionType");
  Value::asString_abi_cxx11_(&pt_str,pVVar5);
  pVVar5 = Value::operator[](this_01,"enableYAMLCompatibility");
  bVar1 = Value::asBool(pVVar5);
  pVVar5 = Value::operator[](this_01,"dropNullPlaceholders");
  bVar2 = Value::asBool(pVVar5);
  pVVar5 = Value::operator[](this_01,"useSpecialFloats");
  useSpecialFloats = Value::asBool(pVVar5);
  pVVar5 = Value::operator[](this_01,"emitUTF8");
  emitUTF8 = Value::asBool(pVVar5);
  pVVar5 = Value::operator[](this_01,"precision");
  UVar3 = Value::asUInt(pVVar5);
  iVar4 = std::__cxx11::string::compare((char *)&cs_str);
  if (iVar4 == 0) {
    cs = All;
  }
  else {
    iVar4 = std::__cxx11::string::compare((char *)&cs_str);
    cs = None;
    if (iVar4 != 0) {
      colonSymbol._M_dataplus._M_p = (pointer)&colonSymbol.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&colonSymbol,"commentStyle must be \'All\' or \'None\'","");
      throwRuntimeError(&colonSymbol);
    }
  }
  iVar4 = std::__cxx11::string::compare((char *)&pt_str);
  if (iVar4 == 0) {
    uVar7 = 0;
  }
  else {
    iVar4 = std::__cxx11::string::compare((char *)&pt_str);
    uVar7 = 1;
    if (iVar4 != 0) {
      colonSymbol._M_dataplus._M_p = (pointer)&colonSymbol.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&colonSymbol,"precisionType must be \'significant\' or \'decimal\'","");
      throwRuntimeError(&colonSymbol);
    }
  }
  colonSymbol._M_dataplus._M_p = (pointer)&colonSymbol.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&colonSymbol," : ","");
  if (bVar1) {
    pcVar6 = ": ";
  }
  else {
    if (indentation._M_string_length != 0) goto LAB_0060b4b6;
    pcVar6 = ":";
  }
  std::__cxx11::string::_M_replace
            ((ulong)&colonSymbol,0,(char *)colonSymbol._M_string_length,(ulong)pcVar6);
LAB_0060b4b6:
  nullSymbol._M_dataplus._M_p = (pointer)&nullSymbol.field_2;
  local_f8 = uVar7;
  std::__cxx11::string::_M_construct<char_const*>((string *)&nullSymbol,"null","");
  if (bVar2) {
    nullSymbol._M_string_length = 0;
    *nullSymbol._M_dataplus._M_p = '\0';
  }
  precision = 0x11;
  if (UVar3 < 0x11) {
    precision = UVar3;
  }
  endingLineFeedSymbol._M_string_length = 0;
  endingLineFeedSymbol.field_2._M_local_buf[0] = '\0';
  endingLineFeedSymbol._M_dataplus._M_p = (pointer)&endingLineFeedSymbol.field_2;
  this_00 = (BuiltStyledStreamWriter *)operator_new(0xe8);
  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_118,indentation._M_dataplus._M_p,
             indentation._M_dataplus._M_p + indentation._M_string_length);
  local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_138,colonSymbol._M_dataplus._M_p,
             colonSymbol._M_dataplus._M_p + colonSymbol._M_string_length);
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d0,nullSymbol._M_dataplus._M_p,
             nullSymbol._M_dataplus._M_p + nullSymbol._M_string_length);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,endingLineFeedSymbol._M_dataplus._M_p,
             endingLineFeedSymbol._M_dataplus._M_p + endingLineFeedSymbol._M_string_length);
  BuiltStyledStreamWriter::BuiltStyledStreamWriter
            (this_00,&local_118,cs,&local_138,&local_d0,&local_50,useSpecialFloats,emitUTF8,
             precision,(PrecisionType)local_f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)endingLineFeedSymbol._M_dataplus._M_p != &endingLineFeedSymbol.field_2) {
    operator_delete(endingLineFeedSymbol._M_dataplus._M_p,
                    CONCAT71(endingLineFeedSymbol.field_2._M_allocated_capacity._1_7_,
                             endingLineFeedSymbol.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)nullSymbol._M_dataplus._M_p != &nullSymbol.field_2) {
    operator_delete(nullSymbol._M_dataplus._M_p,nullSymbol.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)colonSymbol._M_dataplus._M_p != &colonSymbol.field_2) {
    operator_delete(colonSymbol._M_dataplus._M_p,colonSymbol.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pt_str._M_dataplus._M_p != &pt_str.field_2) {
    operator_delete(pt_str._M_dataplus._M_p,pt_str.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)cs_str._M_dataplus._M_p != &cs_str.field_2) {
    operator_delete(cs_str._M_dataplus._M_p,cs_str.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)indentation._M_dataplus._M_p != &indentation.field_2) {
    operator_delete(indentation._M_dataplus._M_p,indentation.field_2._M_allocated_capacity + 1);
  }
  return &this_00->super_StreamWriter;
}

Assistant:

StreamWriter* StreamWriterBuilder::newStreamWriter() const {
  const String indentation = settings_["indentation"].asString();
  const String cs_str = settings_["commentStyle"].asString();
  const String pt_str = settings_["precisionType"].asString();
  const bool eyc = settings_["enableYAMLCompatibility"].asBool();
  const bool dnp = settings_["dropNullPlaceholders"].asBool();
  const bool usf = settings_["useSpecialFloats"].asBool();
  const bool emitUTF8 = settings_["emitUTF8"].asBool();
  unsigned int pre = settings_["precision"].asUInt();
  CommentStyle::Enum cs = CommentStyle::All;
  if (cs_str == "All") {
    cs = CommentStyle::All;
  } else if (cs_str == "None") {
    cs = CommentStyle::None;
  } else {
    throwRuntimeError("commentStyle must be 'All' or 'None'");
  }
  PrecisionType precisionType(significantDigits);
  if (pt_str == "significant") {
    precisionType = PrecisionType::significantDigits;
  } else if (pt_str == "decimal") {
    precisionType = PrecisionType::decimalPlaces;
  } else {
    throwRuntimeError("precisionType must be 'significant' or 'decimal'");
  }
  String colonSymbol = " : ";
  if (eyc) {
    colonSymbol = ": ";
  } else if (indentation.empty()) {
    colonSymbol = ":";
  }
  String nullSymbol = "null";
  if (dnp) {
    nullSymbol.clear();
  }
  if (pre > 17)
    pre = 17;
  String endingLineFeedSymbol;
  return new BuiltStyledStreamWriter(indentation, cs, colonSymbol, nullSymbol,
                                     endingLineFeedSymbol, usf, emitUTF8, pre,
                                     precisionType);
}